

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  int iVar1;
  ImGuiTableSettings *pIVar2;
  ImGuiTableSettings *pIVar3;
  ImGuiTableSettings *pIVar4;
  
  pIVar2 = (ImGuiTableSettings *)(GImGui->SettingsTables).Buf.Data;
  pIVar3 = (ImGuiTableSettings *)&pIVar2->SaveFlags;
  pIVar4 = pIVar2;
  if (pIVar2 != (ImGuiTableSettings *)0x0) {
    while (pIVar4 = pIVar3, pIVar3->ID != id) {
      iVar1._0_1_ = pIVar3[-1].ColumnsCount;
      iVar1._1_1_ = pIVar3[-1].ColumnsCountMax;
      iVar1._2_1_ = pIVar3[-1].WantApply;
      iVar1._3_1_ = pIVar3[-1].field_0xf;
      pIVar3 = (ImGuiTableSettings *)((long)&pIVar3->ID + (long)iVar1);
      if (pIVar3 == (ImGuiTableSettings *)
                    ((long)&pIVar2->SaveFlags + (long)(GImGui->SettingsTables).Buf.Size)) {
        return (ImGuiTableSettings *)0x0;
      }
    }
  }
  return pIVar4;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}